

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void TT_Goto_CodeRange(TT_ExecContext exec,FT_Int range,FT_Long IP)

{
  TT_CodeRange *coderange;
  FT_Long IP_local;
  FT_Int range_local;
  TT_ExecContext exec_local;
  
  exec->code = exec->codeRangeTable[range + -1].base;
  exec->codeSize = exec->codeRangeTable[range + -1].size;
  exec->IP = IP;
  exec->curRange = range;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  TT_Goto_CodeRange( TT_ExecContext  exec,
                     FT_Int          range,
                     FT_Long         IP )
  {
    TT_CodeRange*  coderange;


    FT_ASSERT( range >= 1 && range <= 3 );

    coderange = &exec->codeRangeTable[range - 1];

    FT_ASSERT( coderange->base );

    /* NOTE: Because the last instruction of a program may be a CALL */
    /*       which will return to the first byte *after* the code    */
    /*       range, we test for IP <= Size instead of IP < Size.     */
    /*                                                               */
    FT_ASSERT( IP <= coderange->size );

    exec->code     = coderange->base;
    exec->codeSize = coderange->size;
    exec->IP       = IP;
    exec->curRange = range;
  }